

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::Formatter::Set<char[14]>
          (Formatter *this,string *key,char (*value) [14])

{
  size_t sVar1;
  mapped_type *this_00;
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_68 = local_58;
  sVar1 = strlen(*value);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,value,*value + sVar1);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>((string *)local_48,local_68,local_68 + local_60);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->vars_,key);
  std::__cxx11::string::operator=((string *)this_00,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  return;
}

Assistant:

void Set(const std::string& key, const T& value) {
    vars_[key] = ToString(value);
  }